

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O2

string_t __thiscall
duckdb::CaseConvertOperatorASCII<true>::Operation<duckdb::string_t,duckdb::string_t>
          (CaseConvertOperatorASCII<true> *this,string_t input,Vector *result)

{
  idx_t i;
  Vector *pVVar1;
  char *pcVar2;
  long lVar3;
  idx_t output_length;
  anon_union_16_2_67f50693_for_value local_30;
  undefined8 local_20;
  long local_18;
  
  local_18 = input.value._0_8_;
  lVar3 = local_18;
  if ((uint)this < 0xd) {
    lVar3 = (long)&local_20 + 4;
  }
  local_20 = this;
  local_30.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString
                 (input.value._8_8_,(Vector *)((ulong)this & 0xffffffff),(idx_t)input.value._8_8_);
  pcVar2 = local_30._8_8_;
  if (local_30._0_4_ < 0xd) {
    pcVar2 = local_30.pointer.prefix;
  }
  for (pVVar1 = (Vector *)0x0; (Vector *)((ulong)this & 0xffffffff) != pVVar1;
      pVVar1 = (Vector *)&pVVar1->field_0x1) {
    pcVar2[(long)pVVar1] = StringUtil::ASCII_TO_UPPER_MAP[(&pVVar1->vector_type)[lVar3]];
  }
  string_t::Finalize((string_t *)&local_30.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_30.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		return ASCIICaseConvert<IS_UPPER>(result, input_data, input_length);
	}